

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

HeapTypeGenerator *
wasm::HeapTypeGenerator::create
          (HeapTypeGenerator *__return_storage_ptr__,Random *rand,FeatureSet features,size_t n)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  __index_type _Var2;
  pointer pvVar3;
  Field *pFVar4;
  void *pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer puVar8;
  pointer pTVar9;
  uintptr_t *puVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
  *p_Var14;
  pointer pvVar15;
  size_type sVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  Type TVar20;
  ulong uVar21;
  pointer pvVar22;
  undefined8 *puVar23;
  Type TVar24;
  ulong uVar25;
  long lVar26;
  Shareability SVar27;
  Type *type;
  HeapType HVar28;
  undefined1 auVar29 [8];
  size_t __n;
  iterator iVar30;
  char *pcVar31;
  _Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
  _Var32;
  Field *pFVar33;
  Index j;
  pointer pvVar34;
  uint uVar35;
  Signature SVar36;
  Array AVar37;
  Array AVar38;
  Signature SVar39;
  undefined1 auVar40 [16];
  Field FVar41;
  Field local_1d8;
  undefined1 local_1c0 [112];
  __node_base_ptr *local_150;
  size_type local_148;
  __node_base local_140;
  size_type sStack_138;
  float local_130;
  size_t local_128;
  __node_base_ptr p_Stack_120;
  pointer local_118;
  pointer pvStack_110;
  pointer local_108;
  pointer puStack_100;
  iterator local_f8;
  uint *puStack_f0;
  uint local_e8;
  FuzzParams local_e0;
  undefined8 local_98;
  HeapType supertype;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_60;
  undefined1 auStack_48 [8];
  Index newGroupStart;
  Mutability MStack_3c;
  Field *local_38;
  
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)local_1c0,n);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)(local_1c0 + 8),n,(allocator_type *)auStack_48);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::vector
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             (local_1c0 + 0x20),n,(allocator_type *)&local_60);
  local_1c0._56_8_ = (TypeBuilder *)local_1c0;
  local_1c0._64_8_ =
       (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        *)(local_1c0 + 8);
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::vector
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             (local_1c0 + 0x48),n,(allocator_type *)auStack_48);
  local_150 = &p_Stack_120;
  local_148 = 1;
  local_140._M_nxt = (_Hash_node_base *)0x0;
  sStack_138 = 0;
  local_130 = 1.0;
  local_e0.USABLE_MEMORY.addr = 0;
  local_128 = 0;
  p_Stack_120 = (__node_base_ptr)0x0;
  local_118 = (pointer)0x0;
  pvStack_110 = (pointer)0x0;
  local_108 = (pointer)0x0;
  puStack_100 = (pointer)0x0;
  local_f8._M_current = (uint *)0x0;
  puStack_f0 = (uint *)0x0;
  local_e8 = 0;
  local_1c0._96_8_ = rand;
  local_1c0._104_4_ = features.features;
  FuzzParams::setDefaults(&local_e0);
  p_Var14 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             *)wasm::TypeBuilder::size();
  pvVar7 = pvStack_110;
  pvVar6 = local_118;
  if ((ulong)p_Var14 >> 0x3e != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if ((_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
       *)((long)local_108 - (long)local_118 >> 1) < p_Var14) {
    pvVar15 = std::
              _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
              ::_M_allocate(p_Var14,n);
    pvVar34 = pvVar15;
    for (pvVar22 = local_118; pvVar22 != pvStack_110; pvVar22 = pvVar22 + 1) {
      (pvVar34->
      super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      ).
      super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      .
      super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
           = (pvVar22->
             super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             ).
             super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
      ;
      pvVar34 = pvVar34 + 1;
    }
    if (local_118 != (pointer)0x0) {
      operator_delete(local_118,(long)local_108 - (long)local_118);
    }
    pvStack_110 = (pointer)(((long)pvVar7 - (long)pvVar6) + (long)pvVar15);
    local_108 = pvVar15 + (long)p_Var14;
    local_118 = pvVar15;
  }
  sVar16 = wasm::TypeBuilder::size();
  std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::reserve
            ((vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *)
             (local_1c0 + 0x48),sVar16);
  uVar11 = wasm::TypeBuilder::size();
  uVar11 = Random::upTo(rand,uVar11);
  SVar27 = Shared;
  while (local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_ = SVar27, uVar17 = wasm::TypeBuilder::size(),
        SVar27 < uVar17) {
    uVar18 = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
    newGroupStart =
         (Shareability)
         local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start;
    auStack_48 = (undefined1  [8])uVar18;
    std::
    _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
              ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_150,auStack_48);
    pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_1c0._64_8_)->_M_impl).super__Vector_impl_data._M_start +
             (Shareability)
             local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start);
    iVar30._M_current = *(uint **)(pvVar1 + 8);
    if (iVar30._M_current == *(uint **)(pvVar1 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar1,iVar30,(uint *)&local_60);
    }
    else {
      *iVar30._M_current =
           (Shareability)
           local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(uint **)(pvVar1 + 8) = iVar30._M_current + 1;
    }
    if (((Shareability)
         local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start < uVar11 + Unshared) ||
       (uVar12 = Random::upTo(rand,2), uVar12 == 0)) {
      __n = 3;
      uVar12 = Random::upTo((Random *)local_1c0._96_8_,3);
      pvVar7 = pvStack_110;
      pvVar6 = local_118;
      if (2 < uVar12) {
        wasm::handle_unreachable
                  ("unexpected index",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                   ,0x284);
      }
      _Var32 = SUB42(uVar12 << 8,0);
      if (pvStack_110 == local_108) {
        if ((long)pvStack_110 - (long)local_118 == 0x7ffffffffffffffe) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar25 = (long)pvStack_110 - (long)local_118 >> 1;
        uVar17 = uVar25;
        if (pvStack_110 == local_118) {
          uVar17 = 1;
        }
        p_Var14 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                   *)(uVar17 + uVar25);
        if ((_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             *)0x3ffffffffffffffe < p_Var14) {
          p_Var14 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        if (CARRY8(uVar17,uVar25)) {
          p_Var14 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        pvVar15 = std::
                  _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                  ::_M_allocate(p_Var14,__n);
        lVar26 = (long)pvVar7 - (long)pvVar6;
        *(_Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          *)((long)pvVar15 + lVar26) = _Var32;
        pvVar22 = pvVar6;
        pvVar34 = pvVar15;
        if (lVar26 != 0) {
          do {
            (pvVar34->
            super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            ).
            super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 = (pvVar22->
                   super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   ).
                   super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            ;
            pvVar22 = pvVar22 + 1;
            pvVar34 = pvVar34 + 1;
          } while (pvVar22 != pvVar7);
        }
        if (pvVar6 != (pointer)0x0) {
          operator_delete(pvVar6,(long)local_108 - (long)pvVar6);
        }
        local_108 = pvVar15 + (long)p_Var14;
        local_118 = pvVar15;
      }
      else {
        (pvStack_110->
        super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ).
        super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             = _Var32;
        pvVar34 = pvStack_110;
      }
      SVar27 = (Shareability)
               local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = local_1c0._56_8_;
      pvStack_110 = pvVar34 + 1;
      if ((features.features >> 0x11 & 1) != 0) {
        Random::upTo(rand,2);
      }
      wasm::TypeBuilder::setShared(uVar18,SVar27);
    }
    else {
      uVar12 = Random::upTo(rand,(Shareability)
                                 local_60.
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      SVar27 = (Shareability)
               local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = local_1c0._56_8_;
      uVar17 = (ulong)uVar12;
      uVar19 = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
      wasm::TypeBuilder::setSubType(uVar18,SVar27,uVar19,1);
      SVar27 = (Shareability)
               local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = local_1c0._56_8_;
      TVar20.id = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
      auStack_48 = (undefined1  [8])TVar20.id;
      wasm::HeapType::getShared();
      wasm::TypeBuilder::setShared(uVar18,SVar27);
      (((pointer)
       (local_1c0._72_8_ +
       (ulong)(Shareability)
              local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
              super__Vector_impl_data._M_start * 8))->super__Optional_base<unsigned_int,_true,_true>
      )._M_payload.super__Optional_payload_base<unsigned_int> =
           (_Optional_payload_base<unsigned_int>)(uVar17 | 0x100000000);
      pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
               ((((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)local_1c0._64_8_)->_M_impl).super__Vector_impl_data._M_start + uVar17);
      iVar30._M_current = *(uint **)(pvVar1 + 8);
      if (iVar30._M_current == *(uint **)(pvVar1 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar30,(uint *)&local_60);
      }
      else {
        *iVar30._M_current =
             (Shareability)
             local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
        iVar30._M_current = iVar30._M_current + 1;
        *(uint **)(pvVar1 + 8) = iVar30._M_current;
      }
      pvVar7 = pvStack_110;
      pvVar6 = local_118;
      if (pvStack_110 == local_108) {
        if ((long)pvStack_110 - (long)local_118 == 0x7ffffffffffffffe) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar21 = (long)pvStack_110 - (long)local_118 >> 1;
        uVar25 = uVar21;
        if (pvStack_110 == local_118) {
          uVar25 = 1;
        }
        p_Var14 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                   *)(uVar25 + uVar21);
        if ((_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             *)0x3ffffffffffffffe < p_Var14) {
          p_Var14 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        if (CARRY8(uVar25,uVar21)) {
          p_Var14 = (_Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                     *)0x3fffffffffffffff;
        }
        pvVar15 = std::
                  _Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                  ::_M_allocate(p_Var14,(size_t)iVar30._M_current);
        lVar26 = (long)pvVar7 - (long)pvVar6;
        *(_Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
          *)((long)pvVar15 + lVar26) =
             pvVar6[uVar17].
             super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             .
             super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ;
        pvVar22 = pvVar6;
        pvVar34 = pvVar15;
        if (lVar26 != 0) {
          do {
            (pvVar34->
            super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            ).
            super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 = (pvVar22->
                   super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   ).
                   super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            ;
            pvVar22 = pvVar22 + 1;
            pvVar34 = pvVar34 + 1;
          } while (pvVar22 != pvVar7);
        }
        if (pvVar6 != (pointer)0x0) {
          operator_delete(pvVar6,(long)local_108 - (long)pvVar6);
        }
        local_108 = pvVar15 + (long)p_Var14;
        local_118 = pvVar15;
      }
      else {
        (pvStack_110->
        super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ).
        super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        .
        super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             = local_118[uVar17].
               super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
               .
               super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ;
        pvVar34 = pvStack_110;
      }
      pvStack_110 = pvVar34 + 1;
    }
    SVar27 = (Shareability)
             local_60.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start + Unshared;
  }
  uVar35 = 0;
  while( true ) {
    uVar17 = wasm::TypeBuilder::size();
    uVar18 = local_1c0._56_8_;
    uVar25 = (ulong)uVar35;
    if (uVar17 <= uVar25) break;
    pvVar3 = (((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_1c0._64_8_)->_M_impl).super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar3[uVar25].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar3[uVar25].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data) < 5) {
      Random::upTo(rand,2);
    }
    wasm::TypeBuilder::setOpen(uVar18,SUB41(uVar35,0));
    uVar35 = uVar35 + 1;
  }
  sVar16 = wasm::TypeBuilder::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&puStack_100,sVar16);
  uVar11 = wasm::TypeBuilder::size();
  uVar11 = Random::upTo(rand,uVar11);
  uVar35 = 0;
  uVar17 = 0;
  while( true ) {
    uVar25 = wasm::TypeBuilder::size();
    iVar30._M_current = local_f8._M_current;
    puVar8 = puStack_100;
    if (uVar25 <= uVar35) break;
    lVar26 = wasm::TypeBuilder::size();
    if ((lVar26 - 1U == (ulong)uVar35) || (uVar12 = Random::upTo(rand,uVar11 + 1), uVar12 == 0)) {
      auStack_48._0_4_ = uVar35 + 1;
      wasm::TypeBuilder::createRecGroup(local_1c0._56_8_,uVar17);
      while( true ) {
        if ((uint)auStack_48._0_4_ <= (uint)uVar17) break;
        if (local_f8._M_current == puStack_f0) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&puStack_100,local_f8,
                     (uint *)auStack_48);
        }
        else {
          *local_f8._M_current = auStack_48._0_4_;
          local_f8._M_current = local_f8._M_current + 1;
        }
        uVar17 = (ulong)((uint)uVar17 + 1);
      }
      uVar17 = (ulong)(uint)auStack_48._0_4_;
    }
    uVar35 = uVar35 + 1;
  }
  lVar26 = wasm::TypeBuilder::size();
  if ((long)iVar30._M_current - (long)puVar8 >> 2 != lVar26) {
    __assert_fail("recGroupEnds.size() == builder.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x74,
                  "wasm::(anonymous namespace)::HeapTypeGeneratorImpl::HeapTypeGeneratorImpl(Random &, FeatureSet, size_t)"
                 );
  }
  do {
    uVar25 = (ulong)local_e8;
    uVar17 = wasm::TypeBuilder::size();
    if (uVar17 <= uVar25) {
      wasm::TypeBuilder::TypeBuilder(&__return_storage_ptr__->builder,(TypeBuilder *)local_1c0);
      (__return_storage_ptr__->subtypeIndices).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c0._8_8_;
      (__return_storage_ptr__->subtypeIndices).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c0._16_8_;
      (__return_storage_ptr__->subtypeIndices).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c0._24_8_;
      local_1c0._24_8_ = (pointer)0x0;
      local_1c0._8_8_ = (pointer)0x0;
      local_1c0._16_8_ = (pointer)0x0;
      (__return_storage_ptr__->supertypeIndices).
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c0._32_8_;
      (__return_storage_ptr__->supertypeIndices).
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c0._40_8_;
      (__return_storage_ptr__->supertypeIndices).
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c0._48_8_;
      local_1c0._48_8_ = (pointer)0x0;
      local_1c0._32_8_ = (pointer)0x0;
      local_1c0._40_8_ = (pointer)0x0;
      anon_unknown_24::HeapTypeGeneratorImpl::~HeapTypeGeneratorImpl
                ((HeapTypeGeneratorImpl *)local_1c0);
      return __return_storage_ptr__;
    }
    _Var2 = local_118[local_e8].
            super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Move_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Copy_ctor_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            .
            super__Variant_storage_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
            ._M_index;
    TVar20.id = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
    auStack_48 = (undefined1  [8])TVar20.id;
    SVar27 = wasm::HeapType::getShared();
    uVar18 = local_1c0._96_8_;
    if ((((pointer)(local_1c0._72_8_ + (ulong)local_e8 * 8))->
        super__Optional_base<unsigned_int,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      if (_Var2 == '\x02') {
        _auStack_48 = anon_unknown_24::HeapTypeGeneratorImpl::generateField
                                ((HeapTypeGeneratorImpl *)local_1c0,SVar27);
        AVar37.element.type.id._4_4_ = 0;
        AVar37.element.type.id._0_4_ = local_e8;
        AVar37.element._8_8_ = (allocator_type *)auStack_48;
        wasm::TypeBuilder::setHeapType(local_1c0._56_8_,AVar37);
      }
      else {
        if (_Var2 == '\x01') {
          uVar11 = Random::upTo((Random *)local_1c0._96_8_,local_e0.MAX_STRUCT_SIZE + 1);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48,(ulong)uVar11,
                     (allocator_type *)&supertype);
          pFVar33 = _newGroupStart;
          for (auVar29 = auStack_48; auVar29 != (undefined1  [8])pFVar33;
              auVar29 = (undefined1  [8])((long)auVar29 + 0x10)) {
            FVar41 = anon_unknown_24::HeapTypeGeneratorImpl::generateField
                               ((HeapTypeGeneratorImpl *)local_1c0,SVar27);
            *(Field *)auVar29 = FVar41;
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    (&local_60,(vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48);
          if (auStack_48 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_48,(long)local_38 - (long)auStack_48);
          }
          wasm::TypeBuilder::setHeapType(local_1c0._56_8_,(Struct *)(ulong)local_e8);
          goto LAB_00180a68;
        }
        if (_Var2 != '\0') {
          wasm::handle_unreachable
                    ("unexpected kind",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                     ,0x83);
        }
        uVar11 = Random::upTo((Random *)local_1c0._96_8_,local_e0.MAX_PARAMS);
        uVar11 = Random::upTo((Random *)uVar18,uVar11);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&supertype,(ulong)uVar11,
                   (allocator_type *)auStack_48);
        pTVar9 = types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (HVar28.id = supertype.id; (pointer)HVar28.id != pTVar9; HVar28.id = HVar28.id + 8) {
          TVar20 = anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
                             ((HeapTypeGeneratorImpl *)local_1c0,Unshared);
          ((pointer)HVar28.id)->id = TVar20.id;
        }
        TVar20.id = wasm::TypeBuilder::getTempTupleType((vector *)local_1c0._56_8_);
        uVar11 = Random::upTo((Random *)local_1c0._96_8_,6);
        if (uVar11 != 0) {
          if (((local_1c0._104_4_ & 0x200) == 0) ||
             (uVar11 = Random::upTo((Random *)local_1c0._96_8_,5), uVar11 != 0)) {
            anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
                      ((HeapTypeGeneratorImpl *)local_1c0,Unshared);
          }
          else {
            uVar11 = Random::upTo((Random *)local_1c0._96_8_,local_e0.MAX_TUPLE_SIZE - 1);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
                       (ulong)(uVar11 + 2),(allocator_type *)&local_60);
            puVar10 = (uintptr_t *)_newGroupStart;
            for (auVar29 = auStack_48; uVar18 = local_1c0._56_8_,
                auVar29 != (undefined1  [8])puVar10; auVar29 = (undefined1  [8])((long)auVar29 + 8))
            {
              TVar24 = anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
                                 ((HeapTypeGeneratorImpl *)local_1c0,Unshared);
              *(uintptr_t *)auVar29 = TVar24.id;
            }
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_60,
                       (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48);
            wasm::TypeBuilder::getTempTupleType((vector *)uVar18);
            pvVar5 = (void *)CONCAT44(local_60.
                                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (Shareability)
                                      local_60.
                                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
            if (pvVar5 != (void *)0x0) {
              operator_delete(pvVar5,(long)local_60.
                                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar5);
            }
            if (auStack_48 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_48,(long)local_38 - (long)auStack_48);
            }
          }
        }
        if (supertype.id != 0) {
          operator_delete((void *)supertype.id,
                          (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                _M_impl.super__Vector_impl_data._M_finish - supertype.id);
        }
        SVar39.params.id._4_4_ = 0;
        SVar39.params.id._0_4_ = local_e8;
        SVar39.results.id = TVar20.id;
        wasm::TypeBuilder::setHeapType(local_1c0._56_8_,SVar39);
      }
      goto switchD_0018072e_default;
    }
    local_98 = wasm::TypeBuilder::getTempHeapType(local_1c0._56_8_);
    uVar13 = wasm::HeapType::getKind();
    switch(uVar13) {
    case 0:
      uVar35 = 0x95;
      pcVar31 = "unexpected kind";
      goto LAB_00180c2b;
    case 1:
      auVar40 = wasm::HeapType::getSignature();
      TVar20 = anon_unknown_24::HeapTypeGeneratorImpl::generateSupertype
                         ((HeapTypeGeneratorImpl *)local_1c0,auVar40._0_8_);
      anon_unknown_24::HeapTypeGeneratorImpl::generateSubtype
                ((HeapTypeGeneratorImpl *)local_1c0,(Type)auVar40._8_8_);
      SVar36.params.id._4_4_ = 0;
      SVar36.params.id._0_4_ = local_e8;
      SVar36.results.id = TVar20.id;
      wasm::TypeBuilder::setHeapType(local_1c0._56_8_,SVar36);
      break;
    case 2:
      puVar23 = (undefined8 *)wasm::HeapType::getStruct();
      _auStack_48 = (Field)ZEXT816(0);
      local_38 = (Field *)0x0;
      pFVar4 = (Field *)puVar23[1];
      for (pFVar33 = (Field *)*puVar23; pFVar33 != pFVar4; pFVar33 = pFVar33 + 1) {
        _supertype = anon_unknown_24::HeapTypeGeneratorImpl::generateSubField
                               ((HeapTypeGeneratorImpl *)local_1c0,*pFVar33);
        if (_newGroupStart == local_38) {
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_M_realloc_insert<wasm::Field>
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48,_newGroupStart,
                     (Field *)&supertype);
        }
        else {
          (_newGroupStart->type).id = supertype.id;
          *(pointer *)&_newGroupStart->packedType =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
          _newGroupStart = _newGroupStart + 1;
        }
      }
      for (uVar11 = Random::upTo((Random *)local_1c0._96_8_,
                                 (local_e0.MAX_STRUCT_SIZE -
                                 (int)((ulong)((long)_newGroupStart - (long)auStack_48) >> 4)) + 1);
          uVar11 != 0; uVar11 = uVar11 - 1) {
        _supertype = anon_unknown_24::HeapTypeGeneratorImpl::generateField
                               ((HeapTypeGeneratorImpl *)local_1c0,SVar27);
        if (_newGroupStart == local_38) {
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_M_realloc_insert<wasm::Field>
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48,_newGroupStart,
                     (Field *)&supertype);
        }
        else {
          (_newGroupStart->type).id = supertype.id;
          *(pointer *)&_newGroupStart->packedType =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
          _newGroupStart = _newGroupStart + 1;
        }
      }
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                (&local_60,(vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_48);
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,(long)local_38 - (long)auStack_48);
      }
      wasm::TypeBuilder::setHeapType(local_1c0._56_8_,(Struct *)(ulong)local_e8);
LAB_00180a68:
      pvVar5 = (void *)CONCAT44(local_60.
                                super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (Shareability)
                                local_60.
                                super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_60.
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar5);
      }
      break;
    case 3:
      wasm::HeapType::getArray();
      _auStack_48 = anon_unknown_24::HeapTypeGeneratorImpl::generateSubField
                              ((HeapTypeGeneratorImpl *)local_1c0,local_1d8);
      AVar38.element.type.id._4_4_ = 0;
      AVar38.element.type.id._0_4_ = local_e8;
      AVar38.element._8_8_ = (allocator_type *)auStack_48;
      wasm::TypeBuilder::setHeapType(local_1c0._56_8_,AVar38);
      break;
    case 4:
      uVar35 = 0x93;
      pcVar31 = "TODO: cont";
LAB_00180c2b:
      wasm::handle_unreachable
                (pcVar31,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,uVar35);
    }
switchD_0018072e_default:
    local_e8 = local_e8 + 1;
  } while( true );
}

Assistant:

HeapTypeGenerator
HeapTypeGenerator::create(Random& rand, FeatureSet features, size_t n) {
  return HeapTypeGeneratorImpl(rand, features, n).result;
}